

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseImporter.cpp
# Opt level: O2

void __thiscall Assimp::BaseImporter::UpdateImporterScale(BaseImporter *this,Importer *pImp)

{
  double dVar1;
  double dVar2;
  uint __line;
  Logger *this_00;
  char *__assertion;
  char *local_1a8 [4];
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  
  if (pImp == (Importer *)0x0) {
    __assertion = "pImp != nullptr";
    __line = 0x51;
  }
  else {
    dVar1 = this->importerScale;
    if ((dVar1 != 0.0) || (NAN(dVar1))) {
      dVar2 = this->fileScale;
      if ((dVar2 != 0.0) || (NAN(dVar2))) {
        Importer::SetPropertyFloat(pImp,"APP_SCALE_FACTOR",(float)(dVar1 * dVar2));
        this_00 = DefaultLogger::get();
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        basic_formatter<char[34]>(&local_188,(char (*) [34])"UpdateImporterScale scale set: %f");
        std::ostream::_M_insert<double>(dVar1 * dVar2);
        std::__cxx11::stringbuf::str();
        Logger::debug(this_00,local_1a8[0]);
        std::__cxx11::string::~string((string *)local_1a8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_188);
        return;
      }
      __assertion = "fileScale != 0.0";
      __line = 0x53;
    }
    else {
      __assertion = "importerScale != 0.0";
      __line = 0x52;
    }
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/Common/BaseImporter.cpp"
                ,__line,"virtual void Assimp::BaseImporter::UpdateImporterScale(Importer *)");
}

Assistant:

void BaseImporter::UpdateImporterScale( Importer* pImp )
{
    ai_assert(pImp != nullptr);
    ai_assert(importerScale != 0.0);
    ai_assert(fileScale != 0.0);

    double activeScale = importerScale * fileScale;

    // Set active scaling
    pImp->SetPropertyFloat( AI_CONFIG_APP_SCALE_KEY, static_cast<float>( activeScale) );

    ASSIMP_LOG_DEBUG_F("UpdateImporterScale scale set: %f", activeScale );
}